

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void VP8SetHistogramData(int *distribution,VP8Histogram *histo)

{
  int iVar1;
  int value;
  int k;
  int last_non_zero;
  int max_value;
  VP8Histogram *histo_local;
  int *distribution_local;
  
  max_value = 0;
  last_non_zero = 1;
  for (k = 0; k < 0x20; k = k + 1) {
    iVar1 = distribution[k];
    if (0 < iVar1) {
      if (max_value < iVar1) {
        max_value = iVar1;
      }
      last_non_zero = k;
    }
  }
  histo->max_value = max_value;
  histo->last_non_zero = last_non_zero;
  return;
}

Assistant:

void VP8SetHistogramData(const int distribution[MAX_COEFF_THRESH + 1],
                         VP8Histogram* const histo) {
  int max_value = 0, last_non_zero = 1;
  int k;
  for (k = 0; k <= MAX_COEFF_THRESH; ++k) {
    const int value = distribution[k];
    if (value > 0) {
      if (value > max_value) max_value = value;
      last_non_zero = k;
    }
  }
  histo->max_value = max_value;
  histo->last_non_zero = last_non_zero;
}